

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O2

void basic_io(void)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  undefined8 uVar6;
  runtime_error *prVar7;
  char c;
  mutable_buffer local_268;
  int local_238;
  undefined8 local_230;
  char buf [16];
  stream_socket s2;
  ostringstream oss;
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  local_1c8 [14];
  string str1;
  stream_socket s1;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Test basic io");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::string((string *)&str1,"hello",(allocator *)&oss);
  booster::aio::stream_socket::stream_socket(&s1);
  booster::aio::stream_socket::stream_socket(&s2);
  make_pair(&s1,&s2);
  lVar5 = booster::aio::stream_socket::bytes_readable();
  if (lVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb2);
    std::operator<<(poVar4," s2.bytes_readable()==0");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_268);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::buffer((const_buffer *)&oss,&str1);
  lVar5 = booster::aio::stream_socket::write_some((const_buffer *)&s1);
  std::
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::~_Vector_base(local_1c8);
  if (lVar5 != 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb3);
    std::operator<<(poVar4," s1.write_some(booster::aio::buffer(str1))==5");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_268);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  wait_readable(&s2);
  lVar5 = booster::aio::stream_socket::bytes_readable();
  if (lVar5 != 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb5);
    std::operator<<(poVar4," s2.bytes_readable()==5");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_268);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  booster::aio::buffer((mutable_buffer *)&oss,buf,0x10);
  lVar5 = booster::aio::stream_socket::read_some((mutable_buffer *)&s2);
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                   *)local_1c8);
  if (lVar5 != 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb7);
    std::operator<<(poVar4," s2.read_some(booster::aio::buffer(buf,sizeof(buf)))==5");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_268);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = std::operator==(&str1,buf);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb8);
    std::operator<<(poVar4," str1==buf");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_268);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar5 = booster::aio::stream_socket::bytes_readable();
  if (lVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb9);
    std::operator<<(poVar4," s2.bytes_readable()==0");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_268);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::assign((char *)&str1);
  booster::aio::buffer((const_buffer *)&oss,&str1);
  lVar5 = booster::aio::stream_socket::write_some((const_buffer *)&s2);
  std::
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::~_Vector_base(local_1c8);
  if (lVar5 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbb);
    std::operator<<(poVar4," s2.write_some(io::buffer(str1))==1");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_268);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::aio::buffer((mutable_buffer *)&oss,buf,0x10);
  lVar5 = booster::aio::stream_socket::read_some((mutable_buffer *)&s1);
  cVar1 = buf[0];
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                   *)local_1c8);
  if ((lVar5 == 1) && (cVar1 == 'x')) {
    booster::aio::stream_socket::shutdown(&s1,1);
    local_238 = 0;
    uVar6 = std::_V2::system_category();
    local_230 = uVar6;
    booster::aio::buffer((mutable_buffer *)&oss,buf,1);
    lVar5 = booster::aio::stream_socket::read_some((mutable_buffer *)&s2,(error_code *)&oss);
    iVar2 = local_238;
    if (lVar5 == 0) {
      std::
      _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                       *)local_1c8);
      if (iVar2 == 3) {
        c = 'y';
        booster::aio::buffer(&local_268,&c,1);
        booster::aio::const_buffer::const_buffer((const_buffer *)&oss,&local_268);
        lVar5 = booster::aio::stream_socket::write_some((const_buffer *)&s2);
        std::
        _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ::~_Vector_base(local_1c8);
        std::
        _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ::~_Vector_base(&local_268.super_buffer_impl<char_*>.vec_.
                         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                       );
        if (lVar5 != 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar4 = std::operator<<((ostream *)&oss,"Error ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc1);
          std::operator<<(poVar4," s2.write_some(io::buffer(&c,1))==1");
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar7,(string *)&local_268);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        booster::aio::stream_socket::shutdown(&s2,1);
        c = '\0';
        booster::aio::buffer((mutable_buffer *)&oss,&c,1);
        lVar5 = booster::aio::stream_socket::read_some((mutable_buffer *)&s1);
        cVar1 = c;
        std::
        _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                         *)local_1c8);
        if ((lVar5 == 1) && (cVar1 == 'y')) {
          local_238 = 0;
          local_230 = uVar6;
          booster::aio::buffer((mutable_buffer *)&oss,&c,1);
          lVar5 = booster::aio::stream_socket::read_some((mutable_buffer *)&s1,(error_code *)&oss);
          iVar2 = local_238;
          if (lVar5 == 0) {
            std::
            _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
            ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                             *)local_1c8);
            if (iVar2 == 3) {
              booster::aio::stream_socket::~stream_socket(&s2);
              booster::aio::stream_socket::~stream_socket(&s1);
              std::__cxx11::string::~string((string *)&str1);
              return;
            }
          }
          else {
            std::
            _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
            ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                             *)local_1c8);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar4 = std::operator<<((ostream *)&oss,"Error ");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc6);
          std::operator<<(poVar4,
                          " s1.read_some(io::buffer(&c,1),e)==0 && e.value()==io::aio_error::eof");
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar7,(string *)&local_268);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar4 = std::operator<<((ostream *)&oss,"Error ");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc4);
        std::operator<<(poVar4," s1.read_some(io::buffer(&c,1))==1 && c==\'y\'");
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,(string *)&local_268);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::
      _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                       *)local_1c8);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar4 = std::operator<<((ostream *)&oss,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbf);
    std::operator<<(poVar4," s2.read_some(io::buffer(buf,1),e)==0 && e.value()==io::aio_error::eof")
    ;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)&local_268);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_socket.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbc);
  std::operator<<(poVar4," s1.read_some(io::buffer(buf,sizeof(buf)))==1 && buf[0]==\'x\'");
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar7,(string *)&local_268);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void basic_io()
{
	std::cout << "Test basic io" << std::endl;
	std::string str1="hello";
	io::stream_socket s1,s2;
	make_pair(s1,s2);
	TEST(s2.bytes_readable()==0);
	TEST(s1.write_some(booster::aio::buffer(str1))==5);
	wait_readable(s2);
	TEST(s2.bytes_readable()==5);
	char buf[16] = {0};
	TEST(s2.read_some(booster::aio::buffer(buf,sizeof(buf)))==5);
	TEST(str1==buf);
	TEST(s2.bytes_readable()==0);
	str1="x";
	TEST(s2.write_some(io::buffer(str1))==1);
	TEST(s1.read_some(io::buffer(buf,sizeof(buf)))==1 && buf[0]=='x');
	s1.shutdown(io::stream_socket::shut_wr);
	sys::error_code e;
	TEST(s2.read_some(io::buffer(buf,1),e)==0 && e.value()==io::aio_error::eof);
	char c='y';
	TEST(s2.write_some(io::buffer(&c,1))==1);
	s2.shutdown(io::stream_socket::shut_wr);
	c=0;
	TEST(s1.read_some(io::buffer(&c,1))==1 && c=='y');
	e=sys::error_code();
	TEST(s1.read_some(io::buffer(&c,1),e)==0 && e.value()==io::aio_error::eof);
}